

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall cmTargetSelectLinker::Consider(cmTargetSelectLinker *this,char *lang)

{
  cmGlobalGenerator *this_00;
  int iVar1;
  int iVar2;
  allocator local_41;
  string local_40;
  
  this_00 = this->GG;
  std::__cxx11::string::string((string *)&local_40,lang,&local_41);
  iVar1 = cmGlobalGenerator::GetLinkerPreference(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  iVar2 = this->Preference;
  if (iVar2 < iVar1) {
    this->Preference = iVar1;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&(this->Preferred)._M_t);
    iVar2 = this->Preference;
  }
  if (iVar1 == iVar2) {
    std::__cxx11::string::string((string *)&local_40,lang,&local_41);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->Preferred,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void Consider(const char* lang)
  {
    int preference = this->GG->GetLinkerPreference(lang);
    if (preference > this->Preference) {
      this->Preference = preference;
      this->Preferred.clear();
    }
    if (preference == this->Preference) {
      this->Preferred.insert(lang);
    }
  }